

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall SQLite::Database::key(Database *this,string *aKey)

{
  int iVar1;
  Exception *this_00;
  int passLen;
  string *aKey_local;
  Database *this_local;
  
  iVar1 = std::__cxx11::string::length();
  if (0 < iVar1) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception
              (this_00,"No encryption support, recompile with SQLITE_HAS_CODEC to enable.");
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void Database::key(const std::string& aKey) const
{
    int passLen = static_cast<int>(aKey.length());
#ifdef SQLITE_HAS_CODEC
    if (passLen > 0)
    {
        const int ret = sqlite3_key(getHandle(), aKey.c_str(), passLen);
        check(ret);
    }
#else // SQLITE_HAS_CODEC
    if (passLen > 0)
    {
        throw SQLite::Exception("No encryption support, recompile with SQLITE_HAS_CODEC to enable.");
    }
#endif // SQLITE_HAS_CODEC
}